

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

bool __thiscall
SmallArray<unsigned_char,_16U>::contains(SmallArray<unsigned_char,_16U> *this,uchar *val)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (this->count == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (this->data[uVar2] != *val);
  return uVar2 < this->count;
}

Assistant:

bool contains(const T& val) const
	{
		for(unsigned i = 0; i < count; i++)
		{
			if(data[i] == val)
				return true;
		}

		return false;
	}